

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O0

void __thiscall Memory::CacheAllocator::ZeroAll(CacheAllocator *this)

{
  ArenaMemoryBlock *pAVar1;
  char *pcVar2;
  ArenaMemoryBlock *next;
  ArenaMemoryBlock *memoryBlock;
  BigBlock *blockp;
  CacheAllocator *this_local;
  
  ArenaData::UpdateCacheBlock((ArenaData *)(this + 0x10));
  for (memoryBlock = *(ArenaMemoryBlock **)(this + 0x10); memoryBlock != (ArenaMemoryBlock *)0x0;
      memoryBlock = (memoryBlock->field_0).next) {
    pcVar2 = BigBlock::GetBytes((BigBlock *)memoryBlock);
    memset(pcVar2,0,memoryBlock[1].nbytes);
  }
  for (memoryBlock = *(ArenaMemoryBlock **)(this + 0x18); memoryBlock != (ArenaMemoryBlock *)0x0;
      memoryBlock = (memoryBlock->field_0).next) {
    pcVar2 = BigBlock::GetBytes((BigBlock *)memoryBlock);
    memset(pcVar2,0,memoryBlock[1].nbytes);
  }
  next = *(ArenaMemoryBlock **)(this + 0x20);
  while (next != (ArenaMemoryBlock *)0x0) {
    pAVar1 = (next->field_0).next;
    pcVar2 = ArenaMemoryBlock::GetBytes(next);
    memset(pcVar2,0,next->nbytes);
    next = pAVar1;
  }
  return;
}

Assistant:

void CacheAllocator::ZeroAll()
{
    UpdateCacheBlock();
    BigBlock *blockp = this->bigBlocks;
    while (blockp != NULL)
    {
        memset(blockp->GetBytes(), 0, blockp->currentByte);
        blockp = blockp->nextBigBlock;
    }
    blockp = this->fullBlocks;
    while (blockp != NULL)
    {
        memset(blockp->GetBytes(), 0, blockp->currentByte);
        blockp = blockp->nextBigBlock;
    }

    ArenaMemoryBlock * memoryBlock = this->mallocBlocks;
    while (memoryBlock != nullptr)
    {
        ArenaMemoryBlock * next = memoryBlock->next;
        memset(memoryBlock->GetBytes(), 0, memoryBlock->nbytes);
        memoryBlock = next;
    }
}